

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O1

int key_bytes_to_int(ion_byte_t *key,linear_hash_table_t *linear_hash)

{
  byte *pbVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  
  iVar3 = (linear_hash->super).record.key_size;
  iVar5 = 0;
  if (1 < iVar3) {
    uVar6 = 0;
    iVar5 = 0;
    do {
      pbVar1 = key + uVar6;
      lVar4 = uVar6 + 1;
      piVar2 = key_bytes_to_int::coefficients + uVar6;
      uVar6 = uVar6 + 1;
      iVar5 = iVar5 + (key_bytes_to_int::coefficients[lVar4] - *piVar2) * (uint)*pbVar1;
    } while (iVar3 - 1 != uVar6);
  }
  return iVar5;
}

Assistant:

int
key_bytes_to_int(
	ion_byte_t			*key,
	linear_hash_table_t *linear_hash
) {
	int			i;
	int			key_bytes_as_int	= 0;
	static int	coefficients[]		= { 3, 5, 7, 11, 13, 17, 19 };

	for (i = 0; i < linear_hash->super.record.key_size - 1; i++) {
		key_bytes_as_int += *(key + i) * coefficients[i + 1] - *(key + i) * coefficients[i];
	}

	return key_bytes_as_int;
}